

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O3

void __thiscall Snes_Spc::dsp_write(Snes_Spc *this,int data,rel_time_t time)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  bVar4 = (this->m).smp_regs[0][2];
  iVar2 = (this->m).dsp_time;
  uVar9 = time - (this->reg_times[bVar4] + iVar2);
  if ((int)uVar9 < 0) {
    if (iVar2 == 0x7f) {
      if (bVar4 == 0x5c) {
        piVar1 = &(this->m).skipped_koff;
        *piVar1 = *piVar1 | data;
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 & ~data;
      }
      else {
        if (bVar4 != 0x4c) goto LAB_0059efa8;
        piVar1 = &(this->m).skipped_kon;
        *piVar1 = *piVar1 | ~(uint)(this->dsp).m.regs[0x5c] & data;
      }
      (this->dsp).m.regs[bVar4] = (uint8_t)data;
      bVar7 = bVar4 & 0xf;
      goto LAB_0059f034;
    }
  }
  else {
    uVar9 = uVar9 & 0x7fffffe0;
    (this->m).dsp_time = uVar9 + iVar2 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar9 + 0x20);
    bVar4 = (this->m).smp_regs[0][2];
  }
LAB_0059efa8:
  if ((char)bVar4 < '\0') {
    return;
  }
  (this->dsp).m.regs[bVar4] = (uint8_t)data;
  bVar7 = bVar4 & 0xf;
  if (bVar7 < 2) {
    uVar8 = (uint)(char)(this->dsp).m.regs[bVar4 & 0x70];
    uVar5 = (uint)(char)(this->dsp).m.regs[(ulong)(bVar4 & 0x70) + 1];
    uVar10 = (int)uVar8 >> 7;
    uVar9 = (int)uVar5 >> 7;
    if ((this->dsp).m.surround_threshold <= (int)(uVar5 * uVar8)) {
      uVar10 = 0;
      uVar9 = 0;
    }
    uVar6 = (ulong)((uint)(bVar4 >> 4) * 0x90);
    uVar3 = *(uint *)((long)(this->dsp).m.voices[0].volume + uVar6 + 8);
    *(uint *)((long)(this->dsp).m.voices[0].volume + uVar6) = (uVar10 ^ uVar8) & uVar3;
    *(uint *)((long)(this->dsp).m.voices[0].volume + uVar6 + 4) = (uVar9 ^ uVar5) & uVar3;
    return;
  }
LAB_0059f034:
  if (bVar7 == 0xc) {
    if (bVar4 == 0x7c) {
      (this->dsp).m.regs[0x7c] = '\0';
    }
    else if (bVar4 == 0x4c) {
      (this->dsp).m.new_kon = data & 0xff;
    }
  }
  return;
}

Assistant:

inline void Snes_Spc::dsp_write( int data, rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr]] )
	#if SPC_LESS_ACCURATE
		else if ( m.dsp_time == skipping_time )
		{
			int r = REGS [r_dspaddr];
			if ( r == Spc_Dsp::r_kon )
				m.skipped_kon |= data & ~dsp.read( Spc_Dsp::r_koff );
			
			if ( r == Spc_Dsp::r_koff )
			{
				m.skipped_koff |= data;
				m.skipped_kon &= ~data;
			}
		}
	#endif
	
	#ifdef SPC_DSP_WRITE_HOOK
		SPC_DSP_WRITE_HOOK( m.spc_time + time, REGS [r_dspaddr], (uint8_t) data );
	#endif
	
	if ( REGS [r_dspaddr] <= 0x7F )
		dsp.write( REGS [r_dspaddr], data );
	else if ( !SPC_MORE_ACCURACY )
		debug_printf( "SPC wrote to DSP register > $7F\n" );
}